

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::AddKel
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  TPZFileEqnStorage<double> *this_00;
  int64_t maxeq;
  int64_t mineq;
  TPZEqnArray<double> AuxEqn;
  long local_32c8;
  int64_t local_32c0;
  TPZEqnArray<double> local_32b8;
  
  TPZFrontNonSym<double>::AddKel(&this->fFront,elmat,destinationindex);
  EquationsToDecompose(this,destinationindex,&local_32c0,&local_32c8);
  TPZEqnArray<double>::TPZEqnArray(&local_32b8);
  if (local_32c0 <= local_32c8) {
    TPZFrontNonSym<double>::DecomposeEquations(&this->fFront,local_32c0,local_32c8,&local_32b8);
    CheckCompress(this);
    this_00 = &this->fStorage;
    TPZFileEqnStorage<double>::AddEqnArray(this_00,&local_32b8);
    if (local_32c8 ==
        (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
        fRow + -1) {
      TPZFileEqnStorage<double>::FinishWriting(this_00);
      TPZFileEqnStorage<double>::ReOpen(this_00);
    }
  }
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDecomposed = (char)(this->fFront).super_TPZFront<double>.fDecomposeType;
  TPZEqnArray<double>::~TPZEqnArray(&local_32b8);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex){
	
	// message #1.3 to fFront:TPZFront
	fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
    if (loggerfw.isInfoEnabled())
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< fFront.NElements();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif
	int64_t mineq, maxeq;
	
	EquationsToDecompose(destinationindex, mineq, maxeq);
	TPZEqnArray<TVar> AuxEqn;
	if(maxeq >= mineq) {
		
		fFront.DecomposeEquations(mineq,maxeq,AuxEqn);
		CheckCompress();
		fStorage.AddEqnArray(&AuxEqn);
		if(maxeq == this->Rows()-1){
			fStorage.FinishWriting();
			fStorage.ReOpen();
		}
	}
	this->fDecomposed = fFront.GetDecomposeType();
}